

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_Test::testBody
          (TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  undefined4 extraout_var;
  UtestShell *test;
  MockSupport *pMVar3;
  undefined4 extraout_var_00;
  long *plVar4;
  undefined4 extraout_var_01;
  MockFailureReporterInstaller failureReporterInstaller;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  MockExpectedCallsListForTest expectations;
  SimpleString local_90;
  SimpleString local_80;
  MockExpectedParameterDidntHappenFailure expectedFailure;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&failureReporterInstaller);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest(&expectations);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"foo");
  pMVar2 = MockExpectedCallsListForTest::addFunction(&expectations,(SimpleString *)&expectedFailure)
  ;
  SimpleString::SimpleString(&local_d0,"p1");
  iVar1 = (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0xb])(pMVar2,&local_d0,1);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))((long *)CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_d0,"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            (&expectedFailure,test,&local_d0,&expectations.super_MockExpectedCallsList,
             &expectations.super_MockExpectedCallsList);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_d0,"");
  pMVar3 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_b0);
  SimpleString::SimpleString(&local_c0,"p1");
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x58))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_c0,1);
  (**(code **)(*plVar4 + 0x48))(plVar4);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_d0,"");
  pMVar3 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_b0);
  SimpleString::SimpleString(&local_c0,"p2");
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_01,iVar1),&local_c0,2);
  SimpleString::SimpleString(&local_80,"p3");
  plVar4 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4,&local_80,3);
  SimpleString::SimpleString(&local_90,"p4");
  (**(code **)(*plVar4 + 0x40))(plVar4,&local_90,4);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_d0,"");
  pMVar3 = mock(&local_d0,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])(pMVar3);
  SimpleString::~SimpleString(&local_d0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x23f);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest(&expectations);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&failureReporterInstaller);
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersButExpectedParameterDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1).ignoreOtherParameters();
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters();
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}